

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O3

void __thiscall
MODEL3D::three_dim_model::rotate_vector
          (three_dim_model *this,double cx,double cy,double angle,
          vector<GEO::point,_std::allocator<GEO::point>_> *subject)

{
  double dVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = (angle * 3.141592653589793) / 180.0;
  dVar7 = sin(dVar6);
  dVar6 = cos(dVar6);
  ppVar3 = (subject->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppVar2 = (subject->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar4 = ppVar3;
  if (ppVar3 != ppVar2) {
    do {
      ppVar4->x = ppVar4->x - cx;
      ppVar4->y = ppVar4->y - cy;
      ppVar4 = ppVar4 + 1;
      ppVar5 = ppVar3;
    } while (ppVar4 != ppVar2);
    do {
      dVar1 = ppVar5->x;
      ppVar5->x = dVar1 * dVar6 + -ppVar5->y * dVar7;
      ppVar5->y = (double)(int)dVar1 * dVar7 + dVar6 * ppVar5->y;
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar2);
    do {
      ppVar3->x = ppVar3->x + cx;
      ppVar3->y = ppVar3->y + cy;
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar2);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::rotate_vector(
double cx, double cy, double angle,
std::vector<GEO::point> &subject) // POINT &subject
{
  angle = (angle * PI) / ((double)180); // convert angle to radians
  double s = sin(angle);
  double c = cos(angle);
  auto revert_point_to_origin = [&cx, &cy](GEO::point &n) {
    n.x -= cx;
    n.y -= cy;
  };
  auto rotate_point = [&c, &s](GEO::point &n) {
    int n_x_orig = n.x;
    n.x = n.x * c - n.y * s;
    n.y = n_x_orig * s + n.y * c;
  };
  auto translate_back = [&cx, &cy](GEO::point &n) {
    n.x = n.x + cx;
    n.y = n.y + cy;
  };
  for_each(subject.begin(), subject.end(),
           revert_point_to_origin); // translate points back to origins
  for_each(subject.begin(), subject.end(), rotate_point); // rotate points
  for_each(subject.begin(), subject.end(),
           translate_back); // translate points back
}